

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

int Kit_DsdCofactoringGetVars(Kit_DsdNtk_t **ppNtk,int nSize,int *pVars)

{
  uint Lit;
  int iVar1;
  bool bVar2;
  int local_40;
  int iFaninLit;
  int nVars;
  int Var;
  int v;
  int k;
  int i;
  uint m;
  Kit_DsdObj_t *pObj;
  int *pVars_local;
  int nSize_local;
  Kit_DsdNtk_t **ppNtk_local;
  
  local_40 = 0;
  for (v = 0; v < nSize; v = v + 1) {
    Var = 0;
    while( true ) {
      bVar2 = false;
      if (Var < (int)(uint)ppNtk[v]->nNodes) {
        _i = ppNtk[v]->pNodes[Var];
        bVar2 = _i != (Kit_DsdObj_t *)0x0;
      }
      if (!bVar2) break;
      if ((((uint)*_i >> 6 & 7) == 5) && ((uint)*_i >> 0x1a != 3)) {
        for (k = 0; (uint)k < (uint)*_i >> 0x1a; k = k + 1) {
          Lit = (uint)*(ushort *)((long)&_i[1].field_0x0 + (ulong)(uint)k * 2);
          iVar1 = Kit_DsdLitIsLeaf(ppNtk[v],Lit);
          if (iVar1 != 0) {
            iVar1 = Abc_Lit2Var(Lit);
            for (nVars = 0; (nVars < local_40 && (pVars[nVars] != iVar1)); nVars = nVars + 1) {
            }
            if (nVars == local_40) {
              pVars[local_40] = iVar1;
              local_40 = local_40 + 1;
            }
          }
        }
      }
      Var = Var + 1;
    }
  }
  return local_40;
}

Assistant:

int Kit_DsdCofactoringGetVars( Kit_DsdNtk_t ** ppNtk, int nSize, int * pVars )
{
    Kit_DsdObj_t * pObj;
    unsigned m;
    int i, k, v, Var, nVars, iFaninLit;
    // go through all the networks
    nVars = 0;
    for ( i = 0; i < nSize; i++ )
    {
        // go through the prime objects of each networks
        Kit_DsdNtkForEachObj( ppNtk[i], pObj, k )     
        {
            if ( pObj->Type != KIT_DSD_PRIME )
                continue;
            if ( pObj->nFans == 3 )
                continue;
            // collect direct fanin variables
            Kit_DsdObjForEachFanin( ppNtk[i], pObj, iFaninLit, m )
            {
                if ( !Kit_DsdLitIsLeaf(ppNtk[i], iFaninLit) )
                    continue;
                // add it to the array
                Var = Abc_Lit2Var( iFaninLit );
                for ( v = 0; v < nVars; v++ )
                    if ( pVars[v] == Var )
                        break;
                if ( v == nVars )
                    pVars[nVars++] = Var;
            }
        }
    }
    return nVars;
}